

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiInputSource IVar7;
  int decimal_precision;
  float *pfVar8;
  long lVar9;
  unsigned_long_long uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  undefined4 uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  float fVar22;
  double local_98;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  uVar11 = data_type & 0xfffffffe;
  bVar14 = uVar11 != 8;
  bVar1 = v_max <= v_min;
  bVar2 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar12 = flags & 1;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar6 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar6) || ((pIVar5->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar7 = pIVar5->ActiveIdSource;
      goto LAB_0016e611;
    }
    pfVar8 = ImVec2::operator[](&(pIVar5->IO).MouseDelta,(ulong)uVar12);
    fVar22 = *pfVar8;
    if ((pIVar5->IO).KeyAlt != false) {
      fVar22 = fVar22 * 0.01;
    }
    if ((pIVar5->IO).KeyShift == true) {
      fVar22 = fVar22 * 10.0;
    }
  }
  else {
LAB_0016e611:
    fVar22 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      decimal_precision = 0;
      if (uVar11 == 8) {
        decimal_precision = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar8 = ImVec2::operator[](&local_38,(ulong)uVar12);
      fVar22 = *pfVar8;
      fVar21 = GetMinimumStepAtDecimalPrecision(decimal_precision);
      v_speed = (float)((uint)v_speed & -(uint)(fVar21 <= v_speed) |
                       ~-(uint)(fVar21 <= v_speed) & (uint)fVar21);
    }
  }
  fVar22 = fVar22 * v_speed;
  fVar21 = fVar22;
  if (uVar12 != 0) {
    fVar21 = -fVar22;
  }
  uVar13 = v_max - v_min;
  if (v_max < v_min || uVar13 == 0) {
    bVar6 = false;
LAB_0016e720:
    bVar4 = false;
  }
  else {
    if ((*v < v_max) || (bVar6 = true, fVar21 <= 0.0)) {
      bVar6 = fVar21 < 0.0 && *v <= v_min;
    }
    if ((bVar1 || bVar14) || bVar2) goto LAB_0016e720;
    if ((fVar21 < 0.0) && (0.0 < pIVar5->DragCurrentAccum)) goto LAB_0016e755;
    if (fVar21 <= 0.0) goto LAB_0016e720;
    bVar4 = pIVar5->DragCurrentAccum <= 0.0 && pIVar5->DragCurrentAccum != 0.0;
  }
  if (((pIVar5->ActiveIdIsJustActivated == false) && (!bVar6)) && (!bVar4)) {
    if ((fVar22 != 0.0) || (NAN(fVar22))) {
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum + fVar21;
      pIVar5->DragCurrentAccumDirty = true;
    }
    else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    uVar20 = (undefined4)(uVar13 >> 0x20);
    if ((bVar1 || bVar14) || bVar2) {
      uVar10 = *v + (long)pIVar5->DragCurrentAccum;
      local_98 = 0.0;
    }
    else {
      lVar9 = *v - v_min;
      auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar16._0_8_ = lVar9;
      auVar16._12_4_ = 0x45300000;
      auVar17._8_4_ = uVar20;
      auVar17._0_8_ = uVar13;
      auVar17._12_4_ = 0x45300000;
      local_98 = pow(((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                     ((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)),
                     1.0 / (double)power);
      fVar15 = (float)((double)(pIVar5->DragCurrentAccum / (float)uVar13) + local_98);
      fVar22 = 1.0;
      if (fVar15 <= 1.0) {
        fVar22 = fVar15;
      }
      fVar22 = powf((float)(~-(uint)(fVar15 < 0.0) & (uint)fVar22),power);
      uVar10 = (long)fVar22 * uVar13 + v_min;
    }
    uVar10 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar10);
    pIVar5->DragCurrentAccumDirty = false;
    if ((bVar1 || bVar14) || bVar2) {
      uVar13 = *v;
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(long)(uVar10 - uVar13);
    }
    else {
      lVar9 = uVar10 - v_min;
      auVar18._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar18._0_8_ = lVar9;
      auVar18._12_4_ = 0x45300000;
      auVar19._8_4_ = uVar20;
      auVar19._0_8_ = uVar13;
      auVar19._12_4_ = 0x45300000;
      dVar3 = pow(((auVar18._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                  ((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)),
                  1.0 / (double)power);
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar3 - local_98);
      uVar13 = *v;
    }
    if ((v_min < v_max) && (uVar13 != uVar10)) {
      if ((uVar10 < v_min) || (((uVar11 != 8 && (uVar13 < uVar10)) && (fVar21 < 0.0)))) {
        uVar10 = v_min;
      }
      if ((v_max < uVar10) || (((uVar11 != 8 && (uVar10 < uVar13)) && (0.0 < fVar21)))) {
        uVar10 = v_max;
      }
    }
    if (uVar13 == uVar10) {
      return false;
    }
    *v = uVar10;
    return true;
  }
LAB_0016e755:
  pIVar5->DragCurrentAccum = 0.0;
  pIVar5->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}